

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O2

void UnionRectWithRegion(QRect *rect,QRegionPrivate *source,QRegionPrivate *dest)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  bool bVar5;
  int iVar6;
  long in_FS_OFFSET;
  undefined1 auVar7 [16];
  QRegionPrivate p;
  undefined1 *local_68;
  QArrayDataPointer<QRect> QStack_60;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = rect->x1;
  uVar3 = rect->y1;
  uVar2 = rect->x2;
  uVar4 = rect->y2;
  auVar7._0_4_ = -(uint)((int)uVar2 < (int)uVar1);
  auVar7._4_4_ = auVar7._0_4_;
  auVar7._8_4_ = -(uint)((int)uVar4 < (int)uVar3);
  auVar7._12_4_ = -(uint)((int)uVar4 < (int)uVar3);
  iVar6 = movmskpd((int)local_28,auVar7);
  if (iVar6 == 0) {
    if (dest->numRects == 0) {
      QRegionPrivate::QRegionPrivate((QRegionPrivate *)&local_68,rect);
      QRegionPrivate::operator=(dest,(QRegionPrivate *)&local_68);
    }
    else {
      bVar5 = QRegionPrivate::canAppend(dest,rect);
      if (bVar5) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          QRegionPrivate::append(dest,rect);
          return;
        }
        goto LAB_003d2376;
      }
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      QStack_60.ptr = (QRect *)&DAT_aaaaaaaaaaaaaaaa;
      QStack_60.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      QStack_60.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      QRegionPrivate::QRegionPrivate((QRegionPrivate *)&local_68,rect);
      UnionRegion((QRegionPrivate *)&local_68,source,dest);
    }
    QArrayDataPointer<QRect>::~QArrayDataPointer(&QStack_60);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_003d2376:
  __stack_chk_fail();
}

Assistant:

static void UnionRectWithRegion(const QRect *rect, const QRegionPrivate *source,
                                QRegionPrivate &dest)
{
    if (rect->isEmpty())
        return;

    Q_ASSERT(EqualRegion(source, &dest));

    if (dest.numRects == 0) {
        dest = QRegionPrivate(*rect);
    } else if (dest.canAppend(rect)) {
        dest.append(rect);
    } else {
        QRegionPrivate p(*rect);
        UnionRegion(&p, source, dest);
    }
}